

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O2

void __thiscall soul::Value::PackedData::negateAs<std::complex<double>>(PackedData *this)

{
  undefined8 in_RSI;
  complex<double> cVar1;
  
  cVar1 = getAs<std::complex<double>>(this);
  cVar1._M_value._0_8_ = in_RSI;
  setAs<std::complex<double>>(this,cVar1);
  return;
}

Assistant:

void negateAs() const                   { setAs (-getAs<Primitive>()); }